

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void testJacobiTiming<double>(void)

{
  clock_t cVar1;
  clock_t cVar2;
  ostream *poVar3;
  clock_t cVar4;
  clock_t cVar5;
  int iVar6;
  bool bVar7;
  Matrix33<double> U;
  Vec3<double> S;
  Matrix33<double> V;
  Matrix44<double> local_258;
  Matrix44<double> local_1d8;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  Vec4<double> local_d0;
  Matrix44<double> local_b0;
  
  local_1d8.x[0][0] = 1.0;
  local_1d8.x[0][1] = 0.0;
  local_1d8.x[0][2] = 0.0;
  local_1d8.x[0][3] = 0.0;
  local_1d8.x[1][0] = 1.0;
  local_1d8.x[1][1] = 0.0;
  local_1d8.x[1][2] = 0.0;
  local_1d8.x[1][3] = 0.0;
  local_1d8.x[2][0] = 1.0;
  local_b0.x[0][0] = 1.0;
  local_b0.x[0][1] = 0.0;
  local_b0.x[0][2] = 0.0;
  local_b0.x[0][3] = 0.0;
  local_b0.x[1][0] = 1.0;
  local_b0.x[1][1] = 0.0;
  local_b0.x[1][2] = 0.0;
  local_b0.x[1][3] = 0.0;
  local_150 = 0x3ff0000000000000;
  local_138 = 0;
  local_b0.x[2][0] = 1.0;
  local_148 = 0;
  uStack_140 = 0;
  uStack_130 = 0x3ff0000000000000;
  local_128 = 0;
  uStack_120 = 0;
  local_118 = 0;
  local_110 = 0x3ff0000000000000;
  iVar6 = 100000;
  cVar1 = clock();
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&local_258,&A33_7);
    local_1d8.x[0][0] = local_258.x[0][0];
    local_1d8.x[0][1] = local_258.x[0][1];
    local_1d8.x[0][2] = local_258.x[0][2];
    local_1d8.x[0][3] = local_258.x[0][3];
    local_1d8.x[1][0] = local_258.x[1][0];
    local_1d8.x[1][1] = local_258.x[1][1];
    local_1d8.x[1][2] = local_258.x[1][2];
    local_1d8.x[1][3] = local_258.x[1][3];
    local_1d8.x[2][0] = local_258.x[2][0];
    Imath_3_2::jacobiEigenSolver<double>
              ((Matrix33<double> *)&local_1d8,(Vec3<double> *)&local_d0,
               (Matrix33<double> *)&local_b0);
    Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&local_258,&A33_8);
    local_1d8.x[0][0] = local_258.x[0][0];
    local_1d8.x[0][1] = local_258.x[0][1];
    local_1d8.x[0][2] = local_258.x[0][2];
    local_1d8.x[0][3] = local_258.x[0][3];
    local_1d8.x[1][0] = local_258.x[1][0];
    local_1d8.x[1][1] = local_258.x[1][1];
    local_1d8.x[1][2] = local_258.x[1][2];
    local_1d8.x[1][3] = local_258.x[1][3];
    local_1d8.x[2][0] = local_258.x[2][0];
    Imath_3_2::jacobiEigenSolver<double>
              ((Matrix33<double> *)&local_1d8,(Vec3<double> *)&local_d0,
               (Matrix33<double> *)&local_b0);
  }
  cVar2 = clock();
  poVar3 = std::operator<<((ostream *)&std::cout,"Jacobi EigenSolver of 3x3 matrices took ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3," clocks.");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar6 = 100000;
  cVar4 = clock();
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&local_258,&A33_7);
    local_1d8.x[0][0] = local_258.x[0][0];
    local_1d8.x[0][1] = local_258.x[0][1];
    local_1d8.x[0][2] = local_258.x[0][2];
    local_1d8.x[0][3] = local_258.x[0][3];
    local_1d8.x[1][0] = local_258.x[1][0];
    local_1d8.x[1][1] = local_258.x[1][1];
    local_1d8.x[1][2] = local_258.x[1][2];
    local_1d8.x[1][3] = local_258.x[1][3];
    local_1d8.x[2][0] = local_258.x[2][0];
    Imath_3_2::jacobiSVD<double>
              ((Matrix33 *)&local_1d8,(Matrix33 *)&local_150,(Vec3 *)&local_d0,(Matrix33 *)&local_b0
               ,2.220446049250313e-16,false);
    Imath_3_2::Matrix33<double>::Matrix33((Matrix33<double> *)&local_258,&A33_8);
    local_1d8.x[0][0] = local_258.x[0][0];
    local_1d8.x[0][1] = local_258.x[0][1];
    local_1d8.x[0][2] = local_258.x[0][2];
    local_1d8.x[0][3] = local_258.x[0][3];
    local_1d8.x[1][0] = local_258.x[1][0];
    local_1d8.x[1][1] = local_258.x[1][1];
    local_1d8.x[1][2] = local_258.x[1][2];
    local_1d8.x[1][3] = local_258.x[1][3];
    local_1d8.x[2][0] = local_258.x[2][0];
    Imath_3_2::jacobiSVD<double>
              ((Matrix33 *)&local_1d8,(Matrix33 *)&local_150,(Vec3 *)&local_d0,(Matrix33 *)&local_b0
               ,2.220446049250313e-16,false);
  }
  cVar5 = clock();
  poVar3 = std::operator<<((ostream *)&std::cout,"TinySVD            of 3x3 matrices took ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3," clocks.");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,
                      ((float)((cVar5 - cVar4) - (cVar2 - cVar1)) * 100.0) / (float)(cVar5 - cVar4))
  ;
  poVar3 = std::operator<<(poVar3,"% speed up.");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_1d8.x[0][0] = 1.0;
  local_1d8.x[0][1] = 0.0;
  local_1d8.x[0][2] = 0.0;
  local_1d8.x[0][3] = 0.0;
  local_1d8.x[1][0] = 0.0;
  local_1d8.x[1][1] = 1.0;
  local_1d8.x[1][2] = 0.0;
  local_1d8.x[1][3] = 0.0;
  local_1d8.x[2][0] = 0.0;
  local_1d8.x[2][1] = 0.0;
  local_1d8.x[2][2] = 1.0;
  local_1d8.x[2][3] = 0.0;
  local_1d8.x[3][0] = 0.0;
  local_1d8.x[3][1] = 0.0;
  local_1d8.x[3][2] = 0.0;
  local_1d8.x[3][3] = 1.0;
  local_b0.x[0][0] = 1.0;
  local_b0.x[0][1] = 0.0;
  local_b0.x[0][2] = 0.0;
  local_b0.x[0][3] = 0.0;
  local_b0.x[1][0] = 0.0;
  local_b0.x[1][1] = 1.0;
  local_b0.x[1][2] = 0.0;
  local_b0.x[1][3] = 0.0;
  local_b0.x[2][0] = 0.0;
  local_b0.x[2][1] = 0.0;
  local_b0.x[2][2] = 1.0;
  local_b0.x[2][3] = 0.0;
  local_b0.x[3][0] = 0.0;
  local_b0.x[3][1] = 0.0;
  local_b0.x[3][2] = 0.0;
  local_b0.x[3][3] = 1.0;
  local_150 = 0x3ff0000000000000;
  local_148 = 0;
  uStack_140 = 0;
  local_138 = 0;
  uStack_130 = 0;
  local_128 = 0x3ff0000000000000;
  uStack_120 = 0;
  local_118 = 0;
  local_110 = 0;
  uStack_108 = 0;
  local_100 = 0x3ff0000000000000;
  local_f8 = 0;
  uStack_f0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_d8 = 0x3ff0000000000000;
  iVar6 = 100000;
  cVar1 = clock();
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    Imath_3_2::Matrix44<double>::Matrix44(&local_258,&A44_7);
    local_1d8.x[0][0] = local_258.x[0][0];
    local_1d8.x[0][1] = local_258.x[0][1];
    local_1d8.x[0][2] = local_258.x[0][2];
    local_1d8.x[0][3] = local_258.x[0][3];
    local_1d8.x[1][0] = local_258.x[1][0];
    local_1d8.x[1][1] = local_258.x[1][1];
    local_1d8.x[1][2] = local_258.x[1][2];
    local_1d8.x[1][3] = local_258.x[1][3];
    local_1d8.x[2][0] = local_258.x[2][0];
    local_1d8.x[2][1] = local_258.x[2][1];
    local_1d8.x[2][2] = local_258.x[2][2];
    local_1d8.x[2][3] = local_258.x[2][3];
    local_1d8.x[3][0] = local_258.x[3][0];
    local_1d8.x[3][1] = local_258.x[3][1];
    local_1d8.x[3][2] = local_258.x[3][2];
    local_1d8.x[3][3] = local_258.x[3][3];
    Imath_3_2::jacobiEigenSolver<double>(&local_1d8,&local_d0,&local_b0);
    Imath_3_2::Matrix44<double>::Matrix44(&local_258,&A44_8);
    local_1d8.x[0][0] = local_258.x[0][0];
    local_1d8.x[0][1] = local_258.x[0][1];
    local_1d8.x[0][2] = local_258.x[0][2];
    local_1d8.x[0][3] = local_258.x[0][3];
    local_1d8.x[1][0] = local_258.x[1][0];
    local_1d8.x[1][1] = local_258.x[1][1];
    local_1d8.x[1][2] = local_258.x[1][2];
    local_1d8.x[1][3] = local_258.x[1][3];
    local_1d8.x[2][0] = local_258.x[2][0];
    local_1d8.x[2][1] = local_258.x[2][1];
    local_1d8.x[2][2] = local_258.x[2][2];
    local_1d8.x[2][3] = local_258.x[2][3];
    local_1d8.x[3][0] = local_258.x[3][0];
    local_1d8.x[3][1] = local_258.x[3][1];
    local_1d8.x[3][2] = local_258.x[3][2];
    local_1d8.x[3][3] = local_258.x[3][3];
    Imath_3_2::jacobiEigenSolver<double>(&local_1d8,&local_d0,&local_b0);
  }
  cVar2 = clock();
  poVar3 = std::operator<<((ostream *)&std::cout,"Jacobi EigenSolver of 4x4 matrices took ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3," clocks");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar6 = 100000;
  cVar4 = clock();
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    Imath_3_2::Matrix44<double>::Matrix44(&local_258,&A44_7);
    local_1d8.x[0][0] = local_258.x[0][0];
    local_1d8.x[0][1] = local_258.x[0][1];
    local_1d8.x[0][2] = local_258.x[0][2];
    local_1d8.x[0][3] = local_258.x[0][3];
    local_1d8.x[1][0] = local_258.x[1][0];
    local_1d8.x[1][1] = local_258.x[1][1];
    local_1d8.x[1][2] = local_258.x[1][2];
    local_1d8.x[1][3] = local_258.x[1][3];
    local_1d8.x[2][0] = local_258.x[2][0];
    local_1d8.x[2][1] = local_258.x[2][1];
    local_1d8.x[2][2] = local_258.x[2][2];
    local_1d8.x[2][3] = local_258.x[2][3];
    local_1d8.x[3][0] = local_258.x[3][0];
    local_1d8.x[3][1] = local_258.x[3][1];
    local_1d8.x[3][2] = local_258.x[3][2];
    local_1d8.x[3][3] = local_258.x[3][3];
    Imath_3_2::jacobiSVD<double>
              ((Matrix44 *)&local_1d8,(Matrix44 *)&local_150,(Vec4 *)&local_d0,(Matrix44 *)&local_b0
               ,2.220446049250313e-16,false);
    Imath_3_2::Matrix44<double>::Matrix44(&local_258,&A44_8);
    local_1d8.x[0][0] = local_258.x[0][0];
    local_1d8.x[0][1] = local_258.x[0][1];
    local_1d8.x[0][2] = local_258.x[0][2];
    local_1d8.x[0][3] = local_258.x[0][3];
    local_1d8.x[1][0] = local_258.x[1][0];
    local_1d8.x[1][1] = local_258.x[1][1];
    local_1d8.x[1][2] = local_258.x[1][2];
    local_1d8.x[1][3] = local_258.x[1][3];
    local_1d8.x[2][0] = local_258.x[2][0];
    local_1d8.x[2][1] = local_258.x[2][1];
    local_1d8.x[2][2] = local_258.x[2][2];
    local_1d8.x[2][3] = local_258.x[2][3];
    local_1d8.x[3][0] = local_258.x[3][0];
    local_1d8.x[3][1] = local_258.x[3][1];
    local_1d8.x[3][2] = local_258.x[3][2];
    local_1d8.x[3][3] = local_258.x[3][3];
    Imath_3_2::jacobiSVD<double>
              ((Matrix44 *)&local_1d8,(Matrix44 *)&local_150,(Vec4 *)&local_d0,(Matrix44 *)&local_b0
               ,2.220446049250313e-16,false);
  }
  cVar5 = clock();
  poVar3 = std::operator<<((ostream *)&std::cout,"TinySVD            of 4x4 matrices took ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  poVar3 = std::operator<<(poVar3," clocks");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (&std::cout,
                      ((float)((cVar5 - cVar4) - (cVar2 - cVar1)) * 100.0) / (float)(cVar5 - cVar4))
  ;
  poVar3 = std::operator<<(poVar3,"% speed up.");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void
testJacobiTiming ()
{

    int     rounds (100000);
    clock_t tJacobi, tSVD, t;

    {
        Matrix33<T> A, V, U;
        Vec3<T>     S;

        t = clock ();
        for (int i = 0; i < rounds; ++i)
        {
            A = Matrix33<T> (A33_7);
            jacobiEigenSolver (A, S, V);
            A = Matrix33<T> (A33_8);
            jacobiEigenSolver (A, S, V);
        }
        tJacobi = clock () - t;
        cout << "Jacobi EigenSolver of 3x3 matrices took " << tJacobi
             << " clocks." << endl;

        t = clock ();
        for (int i = 0; i < rounds; ++i)
        {
            A = Matrix33<T> (A33_7);
            jacobiSVD (A, U, S, V);
            A = Matrix33<T> (A33_8);
            jacobiSVD (A, U, S, V);
        }
        tSVD = clock () - t;
        cout << "TinySVD            of 3x3 matrices took " << tSVD << " clocks."
             << endl;
        cout << (float) (tSVD - tJacobi) * 100.0f / (float) (tSVD)
             << "% speed up." << endl;
    }

    {
        Matrix44<T> A, V, U;
        Vec4<T>     S;

        t = clock ();
        for (int i = 0; i < rounds; ++i)
        {
            A = Matrix44<T> (A44_7);
            jacobiEigenSolver (A, S, V);
            A = Matrix44<T> (A44_8);
            jacobiEigenSolver (A, S, V);
        }
        tJacobi = clock () - t;
        cout << "Jacobi EigenSolver of 4x4 matrices took " << tJacobi
             << " clocks" << endl;

        t = clock ();
        for (int i = 0; i < rounds; ++i)
        {
            A = Matrix44<T> (A44_7);
            jacobiSVD (A, U, S, V);
            A = Matrix44<T> (A44_8);
            jacobiSVD (A, U, S, V);
        }
        tSVD = clock () - t;
        cout << "TinySVD            of 4x4 matrices took " << tSVD << " clocks"
             << endl;
        cout << (float) (tSVD - tJacobi) * 100.0f / (float) (tSVD)
             << "% speed up." << endl;
    }
}